

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpl_grammar.h
# Opt level: O0

void __thiscall
VPLGrammar::Parser::ForStatementNode::BuildProgram(ForStatementNode *this,Scope *scope,ostream *out)

{
  int iVar1;
  const_reference pvVar2;
  pointer pAVar3;
  ostream *poVar4;
  int unique_id;
  ostream *out_local;
  Scope *scope_local;
  ForStatementNode *this_local;
  
  iVar1 = vpl::Scope::GetUnique(scope);
  pvVar2 = std::
           vector<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
           ::operator[](&(this->super_ASTNodeBasic).children_,0);
  pAVar3 = std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
           ::operator->(pvVar2);
  (*pAVar3->_vptr_ASTNodeBasic[5])(pAVar3,scope,out);
  poVar4 = std::operator<<(out,"func .L");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
  std::operator<<(poVar4,"_for\n");
  pvVar2 = std::
           vector<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
           ::operator[](&(this->super_ASTNodeBasic).children_,1);
  pAVar3 = std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
           ::operator->(pvVar2);
  (*pAVar3->_vptr_ASTNodeBasic[5])(pAVar3,scope,out);
  poVar4 = std::operator<<(out,"    jz .L");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
  std::operator<<(poVar4,"_end_for\n");
  std::operator<<(out,"    pop 0\n");
  pvVar2 = std::
           vector<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
           ::operator[](&(this->super_ASTNodeBasic).children_,3);
  pAVar3 = std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
           ::operator->(pvVar2);
  (*pAVar3->_vptr_ASTNodeBasic[5])(pAVar3,scope,out);
  pvVar2 = std::
           vector<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
           ::operator[](&(this->super_ASTNodeBasic).children_,2);
  pAVar3 = std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
           ::operator->(pvVar2);
  (*pAVar3->_vptr_ASTNodeBasic[5])(pAVar3,scope,out);
  poVar4 = std::operator<<(out,"    jmp .L");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
  std::operator<<(poVar4,"_for\n");
  poVar4 = std::operator<<(out,"func .L");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
  std::operator<<(poVar4,"_end_for\n");
  std::operator<<(out,"    pop 0\n");
  poVar4 = std::operator<<(out,"func .L");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
  std::operator<<(poVar4,"_end\n");
  return;
}

Assistant:

virtual void BuildProgram(vpl::Scope* scope, std::ostream& out) const override {
                int unique_id = scope->GetUnique();
                children_[0]->BuildProgram(scope, out);
                out << "func .L" << unique_id << "_for\n";
                children_[1]->BuildProgram(scope, out);
                out << "    jz .L" << unique_id << "_end_for\n";
                out << "    pop 0\n";
                children_[3]->BuildProgram(scope, out);
                children_[2]->BuildProgram(scope, out);
                out << "    jmp .L" << unique_id << "_for\n";
                out << "func .L" << unique_id << "_end_for\n";
                out << "    pop 0\n";
                out << "func .L" << unique_id << "_end\n";
            }